

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void VFilter8i_SSE2(uint8_t *u,uint8_t *v,int stride,int thresh,int ithresh,int hev_thresh)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  __m128i *palVar6;
  __m128i *palVar7;
  __m128i *palVar8;
  __m128i *p1_00;
  __m128i *q0_00;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined8 *puVar35;
  undefined8 *puVar36;
  int in_EDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  __m128i V_7;
  __m128i U_7;
  __m128i V_6;
  __m128i U_6;
  __m128i V_5;
  __m128i U_5;
  __m128i V_4;
  __m128i U_4;
  __m128i V_3;
  __m128i U_3;
  __m128i V_2;
  __m128i U_2;
  __m128i V_1;
  __m128i U_1;
  __m128i V;
  __m128i U;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i t2;
  __m128i t1;
  __m128i mask;
  int hev_thresh_00;
  __m128i *mask_00;
  __m128i *q1_00;
  __m128i *q0_01;
  __m128i *p0_00;
  __m128i *p1_01;
  
  uVar1 = *(undefined8 *)((long)in_RDI + (long)in_EDX);
  uVar2 = *(undefined8 *)((long)in_RSI + (long)in_EDX);
  uVar3 = *(undefined8 *)((long)in_RDI + (long)(in_EDX * 2));
  uVar4 = *(undefined8 *)((long)in_RSI + (long)(in_EDX * 2));
  uVar5 = *(undefined8 *)((long)in_RDI + (long)(in_EDX * 3));
  palVar6 = *(__m128i **)((long)in_RSI + (long)(in_EDX * 3));
  auVar34._8_8_ = palVar6;
  auVar34._0_8_ = uVar5;
  auVar33._8_8_ = uVar4;
  auVar33._0_8_ = uVar3;
  psubusb(auVar34,auVar33);
  auVar32._8_8_ = uVar4;
  auVar32._0_8_ = uVar3;
  auVar31._8_8_ = palVar6;
  auVar31._0_8_ = uVar5;
  psubusb(auVar32,auVar31);
  auVar30._8_8_ = uVar2;
  auVar30._0_8_ = uVar1;
  auVar29._8_8_ = *in_RSI;
  auVar29._0_8_ = *in_RDI;
  psubusb(auVar30,auVar29);
  auVar28._8_8_ = *in_RSI;
  auVar28._0_8_ = *in_RDI;
  auVar27._8_8_ = uVar2;
  auVar27._0_8_ = uVar1;
  psubusb(auVar28,auVar27);
  auVar26._8_8_ = uVar4;
  auVar26._0_8_ = uVar3;
  auVar25._8_8_ = uVar2;
  auVar25._0_8_ = uVar1;
  psubusb(auVar26,auVar25);
  auVar24._8_8_ = uVar2;
  auVar24._0_8_ = uVar1;
  auVar23._8_8_ = uVar4;
  auVar23._0_8_ = uVar3;
  psubusb(auVar24,auVar23);
  puVar35 = (undefined8 *)((long)in_RDI + (long)(in_EDX << 2));
  puVar36 = (undefined8 *)((long)in_RSI + (long)(in_EDX << 2));
  palVar7 = (__m128i *)*puVar35;
  p0_00 = (__m128i *)0x0;
  palVar8 = (__m128i *)*puVar36;
  q1_00 = (__m128i *)0x0;
  uVar1 = *(undefined8 *)((long)puVar35 + (long)in_EDX);
  hev_thresh_00 = 0;
  uVar2 = *(undefined8 *)((long)puVar36 + (long)in_EDX);
  p1_00 = *(__m128i **)((long)puVar35 + (long)(in_EDX * 2));
  q0_00 = *(__m128i **)((long)puVar36 + (long)(in_EDX * 2));
  uVar9 = *(undefined8 *)((long)puVar35 + (long)(in_EDX * 3));
  uVar10 = *(undefined8 *)((long)puVar36 + (long)(in_EDX * 3));
  auVar22._8_8_ = palVar8;
  auVar22._0_8_ = palVar7;
  auVar21._8_8_ = uVar2;
  auVar21._0_8_ = uVar1;
  psubusb(auVar22,auVar21);
  auVar20._8_8_ = uVar2;
  auVar20._0_8_ = uVar1;
  auVar19._8_8_ = palVar8;
  auVar19._0_8_ = palVar7;
  psubusb(auVar20,auVar19);
  auVar18._8_8_ = q0_00;
  auVar18._0_8_ = p1_00;
  auVar17._8_8_ = uVar10;
  auVar17._0_8_ = uVar9;
  psubusb(auVar18,auVar17);
  auVar16._8_8_ = uVar10;
  auVar16._0_8_ = uVar9;
  auVar15._8_8_ = q0_00;
  auVar15._0_8_ = p1_00;
  psubusb(auVar16,auVar15);
  auVar14._8_8_ = uVar2;
  auVar14._0_8_ = uVar1;
  auVar13._8_8_ = q0_00;
  auVar13._0_8_ = p1_00;
  psubusb(auVar14,auVar13);
  auVar12._8_8_ = q0_00;
  auVar12._0_8_ = p1_00;
  auVar11._8_8_ = uVar2;
  auVar11._0_8_ = uVar1;
  psubusb(auVar12,auVar11);
  mask_00 = palVar8;
  q0_01 = palVar7;
  p1_01 = palVar6;
  ComplexMask_SSE2(p1_00,(__m128i *)0x0,q0_00,(__m128i *)0x0,(int)((ulong)uVar9 >> 0x20),(int)uVar9,
                   (__m128i *)0x0);
  DoFilter4_SSE2(p1_01,p0_00,q0_01,q1_00,mask_00,hev_thresh_00);
  *(undefined8 *)((long)puVar35 + (long)(in_EDX * -2)) = uVar3;
  *(undefined8 *)((long)puVar36 + (long)(in_EDX * -2)) = uVar4;
  *(undefined8 *)((long)puVar35 + (long)-in_EDX) = uVar5;
  *(__m128i **)((long)puVar36 + (long)-in_EDX) = palVar6;
  *puVar35 = palVar7;
  *puVar36 = palVar8;
  *(undefined8 *)((long)puVar35 + (long)in_EDX) = uVar1;
  *(undefined8 *)((long)puVar36 + (long)in_EDX) = uVar2;
  return;
}

Assistant:

static void VFilter8i_SSE2(uint8_t* u, uint8_t* v, int stride,
                           int thresh, int ithresh, int hev_thresh) {
  __m128i mask;
  __m128i t1, t2, p1, p0, q0, q1;

  // Load p3, p2, p1, p0
  LOADUV_H_EDGES4(u, v, stride, t2, t1, p1, p0);
  MAX_DIFF1(t2, t1, p1, p0, mask);

  u += 4 * stride;
  v += 4 * stride;

  // Load q0, q1, q2, q3
  LOADUV_H_EDGES4(u, v, stride, q0, q1, t1, t2);
  MAX_DIFF2(t2, t1, q1, q0, mask);

  ComplexMask_SSE2(&p1, &p0, &q0, &q1, thresh, ithresh, &mask);
  DoFilter4_SSE2(&p1, &p0, &q0, &q1, &mask, hev_thresh);

  // Store
  STOREUV(p1, u, v, -2 * stride);
  STOREUV(p0, u, v, -1 * stride);
  STOREUV(q0, u, v, 0 * stride);
  STOREUV(q1, u, v, 1 * stride);
}